

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O3

void __thiscall
webrtc::RealFourierOoura::Inverse(RealFourierOoura *this,complex<float> *src,float *dest)

{
  ulong uVar1;
  float *pfVar2;
  complex<float> *dest_complex;
  long lVar3;
  
  lVar3 = this->complex_length_ - 1;
  if (lVar3 != 0) {
    memmove(dest,src,lVar3 * 8);
    pfVar2 = dest;
    do {
      *(ulong *)pfVar2 = *(ulong *)pfVar2 ^ 0x8000000000000000;
      pfVar2 = pfVar2 + 2;
    } while (pfVar2 != dest + lVar3 * 2);
  }
  dest[1] = *(float *)&src[this->complex_length_ - 1]._M_value;
  WebRtc_rdft(this->length_,-1,dest,
              (this->work_ip_)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (this->work_w_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  uVar1 = this->length_;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      *(float *)((long)dest + lVar3) = *(float *)((long)dest + lVar3) * (2.0 / (float)uVar1);
      lVar3 = lVar3 + 4;
    } while (uVar1 << 2 != lVar3);
  }
  return;
}

Assistant:

void RealFourierOoura::Inverse(const complex<float>* src, float* dest) const {
  {
    auto dest_complex = reinterpret_cast<complex<float>*>(dest);
    // The real output array is shorter than the input complex array by one
    // complex element.
    const size_t dest_complex_length = complex_length_ - 1;
    std::copy(src, src + dest_complex_length, dest_complex);
    // Restore Ooura's conjugate definition.
    Conjugate(dest_complex, dest_complex_length);
    // Restore real[n/2] to imag[0].
    dest_complex[0] = complex<float>(dest_complex[0].real(),
                                     src[complex_length_ - 1].real());
  }

  WebRtc_rdft(length_, -1, dest, work_ip_.get(), work_w_.get());

  // Ooura returns a scaled version.
  const float scale = 2.0f / length_;
  std::for_each(dest, dest + length_, [scale](float& v) { v *= scale; });
}